

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_uncompressed.cpp
# Opt level: O3

void duckdb::UncompressedStringStorage::StringFetchRow
               (ColumnSegment *segment,ColumnFetchState *state,row_t row_id,Vector *result,
               idx_t result_idx)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  data_ptr_t pdVar4;
  idx_t iVar5;
  data_ptr_t pdVar6;
  BufferHandle *pBVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  ulong __n;
  char (*__src) [4];
  anon_union_16_2_67f50693_for_value aVar11;
  char local_40 [4];
  undefined4 uStack_3c;
  undefined4 local_38;
  
  pBVar7 = ColumnFetchState::GetOrInsertHandle(state,segment);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&pBVar7->node);
  pdVar4 = ((pBVar7->node).ptr)->buffer;
  iVar5 = segment->offset;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&pBVar7->node);
  uVar1 = *(uint *)(((pBVar7->node).ptr)->buffer + segment->offset + 4);
  uVar2 = *(uint *)(pdVar4 + row_id * 4 + iVar5 + 8);
  uVar10 = -uVar2;
  if (0 < (int)uVar2) {
    uVar10 = uVar2;
  }
  if (row_id != 0) {
    iVar3 = *(int *)(pdVar4 + row_id * 4 + iVar5 + 4);
    iVar8 = -iVar3;
    if (iVar3 < 1) {
      iVar8 = iVar3;
    }
    uVar10 = uVar10 + iVar8;
  }
  pdVar6 = result->data;
  uVar10 = NumericCastImpl<unsigned_int,_int,_false>::Convert(uVar10);
  lVar9 = uVar1 + iVar5;
  if ((int)uVar2 < 0) {
    aVar11.pointer =
         (anon_struct_16_3_d7536bce_for_pointer)
         ReadOverflowString(segment,result,*(block_id_t *)(pdVar4 + (lVar9 - (ulong)-uVar2)),
                            (int32_t)*(block_id_t *)((long)(pdVar4 + (lVar9 - (ulong)-uVar2)) + 8));
    uVar10 = aVar11.pointer.length;
    local_40 = aVar11.pointer.prefix;
  }
  else {
    __n = CONCAT44(0,uVar10);
    __src = (char (*) [4])(pdVar4 + (lVar9 - (ulong)uVar2));
    aVar11.pointer.ptr = (char *)__src;
    aVar11._0_8_ = __n;
    if (uVar10 < 0xd) {
      local_38 = 0;
      local_40[0] = '\0';
      local_40[1] = '\0';
      local_40[2] = '\0';
      local_40[3] = '\0';
      uStack_3c = 0;
      if (uVar10 == 0) {
        local_40[0] = '\0';
        local_40[1] = '\0';
        local_40[2] = '\0';
        local_40[3] = '\0';
        uVar10 = 0;
        aVar11 = (anon_union_16_2_67f50693_for_value)ZEXT816(0);
      }
      else {
        switchD_012bc561::default(local_40,__src,__n);
        aVar11._12_4_ = local_38;
        aVar11._8_4_ = uStack_3c;
      }
    }
    else {
      local_40 = *__src;
    }
  }
  lVar9 = result_idx * 0x10;
  *(uint *)(pdVar6 + lVar9) = uVar10;
  *(char (*) [4])(pdVar6 + lVar9 + 4) = local_40;
  *(char **)(pdVar6 + lVar9 + 8) = aVar11.pointer.ptr;
  return;
}

Assistant:

void UncompressedStringStorage::StringFetchRow(ColumnSegment &segment, ColumnFetchState &state, row_t row_id,
                                               Vector &result, idx_t result_idx) {
	// fetch a single row from the string segment
	// first pin the main buffer if it is not already pinned
	auto &handle = state.GetOrInsertHandle(segment);

	auto baseptr = handle.Ptr() + segment.GetBlockOffset();
	auto dict_end = GetDictionaryEnd(segment, handle);
	auto base_data = reinterpret_cast<int32_t *>(baseptr + DICTIONARY_HEADER_SIZE);
	auto result_data = FlatVector::GetData<string_t>(result);

	auto dict_offset = base_data[row_id];
	uint32_t string_length;
	if (DUCKDB_UNLIKELY(row_id == 0LL)) {
		// edge case where this is the first string in the dict
		string_length = NumericCast<uint32_t>(std::abs(dict_offset));
	} else {
		string_length = NumericCast<uint32_t>(std::abs(dict_offset) - std::abs(base_data[row_id - 1]));
	}
	result_data[result_idx] = FetchStringFromDict(segment, dict_end, result, baseptr, dict_offset, string_length);
}